

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_date(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type previous;
  size_type previous_00;
  Datetime *pDVar4;
  int year;
  int weekday;
  int month;
  int day;
  int week;
  int julian;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  pDVar4 = (Datetime *)pig;
  previous = Pig::cursor(pig);
  local_40 = 0;
  local_38 = 0;
  local_2c = 0;
  local_30 = 0;
  local_3c = 0;
  local_34 = 0;
  bVar1 = parse_year(pDVar4,pig,&local_40);
  if (bVar1) {
    previous_00 = Pig::cursor(pig);
    pDVar4 = (Datetime *)pig;
    bVar1 = Pig::skip(pig,0x57);
    if ((bVar1) && (bVar1 = parse_week(pDVar4,pig,&local_30), bVar1)) {
      bVar1 = parse_weekday(pDVar4,pig,&local_3c);
      if (!bVar1) {
        local_3c = weekstart;
      }
      uVar3 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = local_40;
        this->_week = local_30;
        this->_weekday = local_3c;
        return true;
      }
    }
    pDVar4 = (Datetime *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_julian(pDVar4,pig,&local_2c);
    if (bVar1) {
      uVar3 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar3);
      if (!bVar1) {
        this->_year = local_40;
        this->_julian = local_2c;
        return true;
      }
    }
    pDVar4 = (Datetime *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_month(pDVar4,pig,&local_38);
    if (bVar1) {
      bVar1 = parse_day(pDVar4,pig,&local_34);
      uVar3 = Pig::peek(pig);
      bVar2 = unicodeLatinDigit(uVar3);
      if (bVar1) {
        if (!bVar2) {
          this->_year = local_40;
          this->_month = local_38;
          this->_day = local_34;
          return true;
        }
      }
      else if (!bVar2) {
        this->_year = local_40;
        this->_month = local_38;
        this->_day = 1;
        return true;
      }
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_date (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int year {};
  int month {};
  int julian {};
  int week {};
  int weekday {};
  int day {};
  if (parse_year (pig, year))
  {
    auto checkpointYear = pig.cursor ();

    if (pig.skip ('W') &&
        parse_week (pig, week))
    {
      if (! (parse_weekday (pig, weekday)))
        weekday = Datetime::weekstart;

      if (! unicodeLatinDigit (pig.peek ()))
      {
        _year = year;
        _week = week;
        _weekday = weekday;
        return true;
      }
    }

    pig.restoreTo (checkpointYear);

    if (parse_julian (pig, julian) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _julian = julian;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month))
    {
      if (parse_day (pig, day))
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = day;
          return true;
        }
      }
      else
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = 1;
          return true;
        }
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}